

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VGetCommunicator(N_Vector W,SUNComm comm,int myid)

{
  int iVar1;
  char *__format;
  
  iVar1 = N_VGetCommunicator();
  if (iVar1 == 0 && comm == 0) {
    puts("PASSED test -- N_VGetCommunicator");
    iVar1 = 0;
  }
  else {
    if (iVar1 == 0) {
      __format = ">>> FAILED test -- N_VGetCommunicator, Proc %d (incorrectly reports NULL comm)\n";
    }
    else {
      if (comm != 0) {
        if (myid != 0) {
          return 0;
        }
        printf(">>> FAILED test -- N_VGetCommunicator, Proc %d has non-NULL comm with MPI disabled\n"
               ,0);
        return 0;
      }
      __format = 
      ">>> FAILED test -- N_VGetCommunicator, Proc %d (incorrectly reports non-NULL comm)\n";
    }
    printf(__format,(ulong)(uint)myid);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Test_N_VGetCommunicator(N_Vector W, SUNComm comm, int myid)
{
  SUNComm wcomm;

  /* ask W for its communicator */
  wcomm = N_VGetCommunicator(W);

  /* return with success if both are NULL */
  if ((wcomm == SUN_COMM_NULL) && (comm == SUN_COMM_NULL))
  {
    printf("PASSED test -- N_VGetCommunicator\n");
    return (0);
  }

  /* return with failure if either is NULL */
  if (wcomm == SUN_COMM_NULL)
  {
    printf(">>> FAILED test -- N_VGetCommunicator, Proc %d (incorrectly "
           "reports NULL comm)\n",
           myid);
    return (1);
  }
  if (comm == SUN_COMM_NULL)
  {
    printf(">>> FAILED test -- N_VGetCommunicator, Proc %d (incorrectly "
           "reports non-NULL comm)\n",
           myid);
    return (1);
  }

  if (myid == 0)
  {
    printf(">>> FAILED test -- N_VGetCommunicator, Proc %d has non-NULL comm "
           "with MPI disabled\n",
           myid);
  }

  return (0);
}